

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v11::detail::dragonbox::shorter_interval_case<double>(int exponent)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint128_fallback uVar13;
  decimal_fp<double> dVar14;
  
  if (0x1721 < exponent + 0xba9U) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xd3,"too large exponent");
  }
  iVar6 = exponent * 0x9a209 + -0x3fe1f >> 0x15;
  cVar7 = (char)(iVar6 * -0x1a934f >> 0x13) + (char)exponent;
  uVar13 = cache_accessor<double>::get_cached_power(-iVar6);
  uVar10 = uVar13.hi_;
  bVar3 = 0xb - cVar7;
  uVar11 = (uVar10 >> 0x35) + uVar10 >> (bVar3 & 0x3f);
  uVar12 = (ulong)((exponent & 0xfffffffeU) != 2) + (uVar10 - (uVar10 >> 0x36) >> (bVar3 & 0x3f));
  uVar8 = uVar11 / 10;
  if (uVar8 * 10 < uVar12) {
    uVar10 = (uVar10 >> (10U - cVar7 & 0x3f)) + 1 >> 1;
    if (exponent == -0x4d) {
      uVar10 = uVar10 & 0xfffffffffffffffe;
    }
    else {
      uVar10 = uVar10 + (uVar10 < uVar12);
    }
  }
  else {
    if (uVar11 < 10) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x497,"");
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    if (SUB168(auVar1 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar1 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar5 = (uint)(uVar8 / 100000000);
      if (uVar5 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x482,"");
      }
      uVar2 = 8;
      for (uVar9 = uVar5 * 0x40000000 | uVar5 * -0x3d70a3d7 >> 2; uVar9 < 0x28f5c29;
          uVar9 = uVar9 * 0x40000000 | uVar9 * -0x3d70a3d7 >> 2) {
        uVar2 = uVar2 + 2;
        uVar5 = uVar9;
      }
      uVar4 = uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f;
      uVar9 = (uint)(uVar4 < 0x1999999a);
      if (uVar4 >= 0x1999999a) {
        uVar4 = uVar5;
      }
      uVar10 = (ulong)uVar4;
    }
    else {
      uVar10 = uVar8 * -0x70a3d70a3d70a3d7 >> 2 | uVar8 << 0x3e;
      uVar2 = 0;
      if (uVar10 < 0x28f5c28f5c28f5d) {
        uVar2 = 0;
        do {
          uVar8 = uVar10;
          uVar2 = uVar2 + 2;
          uVar10 = uVar8 * -0x70a3d70a3d70a3d7 >> 2 | uVar8 << 0x3e;
        } while (uVar10 < 0x28f5c28f5c28f5d);
      }
      uVar10 = uVar8 * -0x3333333333333333 >> 1 | uVar8 << 0x3f;
      uVar9 = (uint)(uVar10 < 0x199999999999999a);
      if (uVar10 >= 0x199999999999999a) {
        uVar10 = uVar8;
      }
    }
    iVar6 = iVar6 + 1 + (uVar9 | uVar2);
  }
  dVar14.exponent = iVar6;
  dVar14.significand = uVar10;
  dVar14._12_4_ = 0;
  return dVar14;
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}